

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::Orphan<capnp::compiler::Token>_>::setCapacity
          (Vector<capnp::Orphan<capnp::compiler::Token>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_> newBuilder;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::Orphan<capnp::compiler::Token>>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Token>>::
  addAll<kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Token>>>
            ((ArrayBuilder<capnp::Orphan<capnp::compiler::Token>> *)&local_30,&this->builder);
  ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }